

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.cpp
# Opt level: O3

bool Diligent::VerifyCopyBLASAttribs(IRenderDevice *pDevice,CopyBLASAttribs *Attribs)

{
  char (*Args_1) [20];
  char (*Args_2) [18];
  int iVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  long lVar5;
  ulong uVar6;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  char (*in_RCX) [73];
  char (*Args_1_00) [74];
  bool bVar7;
  char (*Args_5) [3];
  char (*Args_7) [34];
  char (*pacVar8) [30];
  string msg;
  uint local_64;
  char *local_60;
  char *local_58;
  long local_50;
  char (*local_48) [74];
  char (*local_40) [26];
  long local_38;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  if (Attribs->pSrc == (IBottomLevelAS *)0x0) {
    FormatString<char[32],char[23]>
              (&msg,(Diligent *)"Copy BLAS attribs are invalid: ",
               (char (*) [32])"pSrc must not be null.",(char (*) [23])in_RCX);
    in_RCX = (char (*) [73])0x396;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"VerifyCopyBLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x396);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if (Attribs->pDst == (IBottomLevelAS *)0x0) {
    FormatString<char[32],char[23]>
              (&msg,(Diligent *)"Copy BLAS attribs are invalid: ",
               (char (*) [32])"pDst must not be null.",(char (*) [23])in_RCX);
    in_RCX = (char (*) [73])0x397;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"VerifyCopyBLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x397);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if (Attribs->Mode == COPY_AS_MODE_COMPACT) {
    iVar1 = (*(Attribs->pSrc->super_IDeviceObject).super_IObject._vptr_IObject[4])();
    iVar3 = (*(Attribs->pDst->super_IDeviceObject).super_IObject._vptr_IObject[4])();
    if ((*(byte *)(CONCAT44(extraout_var_02,iVar1) + 0x24) & 2) == 0) {
      FormatString<char[32],char[73]>
                (&msg,(Diligent *)"Copy BLAS attribs are invalid: ",
                 (char (*) [32])
                 "must be have been create with RAYTRACING_BUILD_AS_ALLOW_COMPACTION flag.",in_RCX);
      in_RCX = (char (*) [73])0x3db;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyCopyBLASAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x3db);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
    bVar7 = true;
    if (*(long *)(CONCAT44(extraout_var_03,iVar3) + 0x28) == 0) {
      FormatString<char[32],char[56]>
                (&msg,(Diligent *)"Copy BLAS attribs are invalid: ",
                 (char (*) [32])"pDst must have been create with non-zero CompactedSize.",
                 (char (*) [56])in_RCX);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyCopyBLASAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x3dc);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else if (Attribs->Mode == COPY_AS_MODE_CLONE) {
    iVar1 = (*(pDevice->super_IObject)._vptr_IObject[0x18])(pDevice);
    bVar7 = true;
    if (*(int *)CONCAT44(extraout_var,iVar1) == 5) {
      iVar1 = (*(Attribs->pSrc->super_IDeviceObject).super_IObject._vptr_IObject[4])();
      lVar4 = CONCAT44(extraout_var_00,iVar1);
      Args_5 = (char (*) [3])0x477e1e;
      iVar1 = (*(Attribs->pDst->super_IDeviceObject).super_IObject._vptr_IObject[4])();
      lVar5 = CONCAT44(extraout_var_01,iVar1);
      local_40 = (char (*) [26])(lVar4 + 0x10);
      local_50 = lVar4;
      if (*(int *)(lVar4 + 0x10) != *(int *)(lVar5 + 0x10)) {
        FormatString<char[32],char[26],unsigned_int,char[49],unsigned_int,char[3]>
                  (&msg,(Diligent *)"Copy BLAS attribs are invalid: ",
                   (char (*) [32])"Src BLAS triangle count (",local_40,
                   (uint *)") must be equal to the dst BLAS triangle count (",
                   (char (*) [49])(lVar5 + 0x10),(uint *)0x75ce90,Args_5);
        Args_5 = (char (*) [3])0x477e8e;
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"VerifyCopyBLASAttribs",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x3a1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          Args_5 = (char (*) [3])0x477ea9;
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
      Args_1_00 = (char (*) [74])(local_50 + 0x20);
      local_48 = Args_1_00;
      if (*(int *)(local_50 + 0x20) != *(int *)(lVar5 + 0x20)) {
        FormatString<char[32],char[21],unsigned_int,char[44],unsigned_int,char[3]>
                  (&msg,(Diligent *)"Copy BLAS attribs are invalid: ",
                   (char (*) [32])"Src BLAS box count (",(char (*) [21])Args_1_00,
                   (uint *)") must be equal to the dst BLAS box count (",
                   (char (*) [44])(lVar5 + 0x20),(uint *)0x75ce90,Args_5);
        Args_1_00 = (char (*) [74])0x3a4;
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"VerifyCopyBLASAttribs",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x3a4);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
      if (*(char *)(local_50 + 0x24) != *(char *)(lVar5 + 0x24)) {
        FormatString<char[32],char[74]>
                  (&msg,(Diligent *)"Copy BLAS attribs are invalid: ",
                   (char (*) [32])
                   "Source and destination BLASes must have been created with the same flags.",
                   Args_1_00);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"VerifyCopyBLASAttribs",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x3a7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
      local_64 = 0;
      local_38 = lVar5;
      if (*(int *)*local_40 != 0) {
        do {
          Args_1 = (char (*) [20])(*(long *)(local_50 + 8) + (ulong)local_64 * 0x18);
          Args_7 = (char (*) [34])0x477fe3;
          uVar2 = (*(Attribs->pDst->super_IDeviceObject).super_IObject._vptr_IObject[8])
                            (Attribs->pDst,*(undefined8 *)*Args_1);
          if (uVar2 == 0xffffffff) {
            FormatString<char[32],char[20],char_const*,char[13],unsigned_int,char[23]>
                      (&msg,(Diligent *)"Copy BLAS attribs are invalid: ",
                       (char (*) [32])"Src GeometryName (\'",Args_1,(char **)"\') at index ",
                       (char (*) [13])&local_64,(uint *)0x754107,(char (*) [23])Args_7);
            Args_7 = (char (*) [34])0x478035;
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"VerifyCopyBLASAttribs",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                       ,0x3ae);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != &msg.field_2) {
              Args_7 = (char (*) [34])0x478050;
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            }
          }
          lVar4 = *(long *)(local_38 + 8);
          uVar6 = (ulong)uVar2;
          if (*(int *)(*Args_1 + 8) != *(int *)(lVar4 + 8 + uVar6 * 0x18)) {
            FormatString<char[32],char[23],unsigned_int,char[43],unsigned_int,char[39],unsigned_int,char[34]>
                      (&msg,(Diligent *)"Copy BLAS attribs are invalid: ",(char (*) [32])0x753f9b,
                       (char (*) [23])(*Args_1 + 8),
                       (uint *)") in source triangle description at index ",(char (*) [43])&local_64
                       ,(uint *)" does not match MaxVertexCount value (",
                       (char (*) [39])(lVar4 + uVar6 * 0x18 + 8),
                       (uint *)") in the destination description.",Args_7);
            Args_7 = (char (*) [34])0x4780c7;
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"VerifyCopyBLASAttribs",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                       ,0x3b3);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != &msg.field_2) {
              Args_7 = (char (*) [34])0x4780e2;
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            }
          }
          lVar4 = lVar4 + uVar6 * 0x18;
          if ((*Args_1)[0xc] != *(VALUE_TYPE *)(lVar4 + 0xc)) {
            local_60 = GetValueTypeString((*Args_1)[0xc]);
            pacVar8 = (char (*) [30])0x478108;
            local_58 = GetValueTypeString(*(VALUE_TYPE *)(lVar4 + 0xc));
            FormatString<char[32],char[24],char_const*,char[43],unsigned_int,char[40],char_const*,char[30]>
                      (&msg,(Diligent *)"Copy BLAS attribs are invalid: ",(char (*) [32])0x753fe4,
                       (char (*) [24])&local_60,
                       (char **)") in source triangle description at index ",
                       (char (*) [43])&local_64,(uint *)" does not match VertexValueType value (",
                       (char (*) [40])&local_58,(char **)") in destination description.",pacVar8);
            Args_7 = (char (*) [34])0x478168;
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"VerifyCopyBLASAttribs",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                       ,0x3b6);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != &msg.field_2) {
              Args_7 = (char (*) [34])0x478183;
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            }
          }
          if ((*Args_1)[0xd] != *(byte *)(lVar4 + 0xd)) {
            local_60 = (char *)CONCAT44(local_60._4_4_,(uint)(byte)(*Args_1)[0xd]);
            local_58 = (char *)CONCAT44(local_58._4_4_,(uint)*(byte *)(lVar4 + 0xd));
            FormatString<char[32],char[29],unsigned_int,char[43],unsigned_int,char[45],unsigned_int,char[30]>
                      (&msg,(Diligent *)"Copy BLAS attribs are invalid: ",(char (*) [32])0x75402a,
                       (char (*) [29])&local_60,(uint *)") in source triangle description at index "
                       ,(char (*) [43])&local_64,
                       (uint *)" does not match VertexComponentCount value (",
                       (char (*) [45])&local_58,(uint *)") in destination description.",
                       (char (*) [30])Args_7);
            Args_7 = (char (*) [34])0x4781f2;
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"VerifyCopyBLASAttribs",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                       ,0x3b9);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != &msg.field_2) {
              Args_7 = (char (*) [34])0x47820d;
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            }
          }
          if (*(int *)(*Args_1 + 0x10) != *(int *)(lVar4 + 0x10)) {
            FormatString<char[32],char[26],unsigned_int,char[43],unsigned_int,char[42],unsigned_int,char[30]>
                      (&msg,(Diligent *)"Copy BLAS attribs are invalid: ",(char (*) [32])0x754057,
                       (char (*) [26])(*Args_1 + 0x10),
                       (uint *)") in source triangle description at index ",(char (*) [43])&local_64
                       ,(uint *)" does not match MaxPrimitiveCount value (",
                       (char (*) [42])(lVar4 + 0x10),(uint *)") in destination description.",
                       (char (*) [30])Args_7);
            Args_7 = (char (*) [34])0x47826f;
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"VerifyCopyBLASAttribs",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                       ,0x3bc);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != &msg.field_2) {
              Args_7 = (char (*) [34])0x47828a;
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            }
          }
          if (Args_1[1][0] != *(VALUE_TYPE *)(lVar4 + 0x14)) {
            local_60 = GetValueTypeString(Args_1[1][0]);
            pacVar8 = (char (*) [30])0x4782ac;
            local_58 = GetValueTypeString(*(VALUE_TYPE *)(lVar4 + 0x14));
            FormatString<char[32],char[18],char_const*,char[43],unsigned_int,char[34],char_const*,char[30]>
                      (&msg,(Diligent *)"Copy BLAS attribs are invalid: ",(char (*) [32])0x754081,
                       (char (*) [18])&local_60,
                       (char **)") in source triangle description at index ",
                       (char (*) [43])&local_64,(uint *)" does not match IndexType value (",
                       (char (*) [34])&local_58,(char **)") in destination description.",pacVar8);
            Args_7 = (char (*) [34])0x47830c;
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"VerifyCopyBLASAttribs",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                       ,0x3bf);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != &msg.field_2) {
              Args_7 = (char (*) [34])0x478327;
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            }
          }
          if (Args_1[1][1] != *(char *)(lVar4 + 0x15)) {
            local_60 = "false";
            if (Args_1[1][1] != '\0') {
              local_60 = "true";
            }
            local_58 = "false";
            if (*(char *)(lVar4 + 0x15) != '\0') {
              local_58 = "true";
            }
            FormatString<char[32],char[25],char_const*,char[43],unsigned_int,char[41],char_const*,char[30]>
                      (&msg,(Diligent *)"Copy BLAS attribs are invalid: ",(char (*) [32])0x7540a3,
                       (char (*) [25])&local_60,
                       (char **)") in source triangle description at index ",
                       (char (*) [43])&local_64,(uint *)" does not match AllowsTransforms value (",
                       (char (*) [41])&local_58,(char **)") in destination description.",
                       (char (*) [30])Args_7);
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"VerifyCopyBLASAttribs",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                       ,0x3c2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != &msg.field_2) {
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            }
          }
          local_64 = local_64 + 1;
        } while (local_64 < *(uint *)*local_40);
      }
      local_60 = (char *)((ulong)local_60 & 0xffffffff00000000);
      if (*(int *)*local_48 != 0) {
        uVar2 = 0;
        do {
          Args_2 = (char (*) [18])(*(long *)(local_50 + 0x18) + (ulong)uVar2 * 0x10);
          pacVar8 = (char (*) [30])0x47843f;
          uVar2 = (*(Attribs->pDst->super_IDeviceObject).super_IObject._vptr_IObject[8])
                            (Attribs->pDst,
                             *(undefined8 *)(*(long *)(local_50 + 0x18) + (ulong)uVar2 * 0x10));
          if (uVar2 == 0xffffffff) {
            FormatString<char[55],unsigned_int,char[18],char_const*,char[25]>
                      (&msg,(Diligent *)"Copy BLAS attribs are invalid: pSrc->GetDesc().pBoxes[",
                       (char (*) [55])&local_60,(uint *)"].GeometryName (\'",Args_2,
                       (char **)"\') is not found in pDst.",(char (*) [25])msg._M_dataplus._M_p);
            if (DebugMessageCallback != (undefined *)0x0) {
              (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0,0);
            }
            goto LAB_00478600;
          }
          if (*(int *)(*Args_2 + 8) !=
              *(int *)(*(long *)(local_38 + 0x18) + 8 + (ulong)uVar2 * 0x10)) {
            FormatString<char[32],char[20],unsigned_int,char[38],unsigned_int,char[36],unsigned_int,char[30]>
                      (&msg,(Diligent *)"Copy BLAS attribs are invalid: ",(char (*) [32])0x754154,
                       (char (*) [20])(*Args_2 + 8),(uint *)") in source box description at index ",
                       (char (*) [38])&local_60,(uint *)" does not match MaxBoxCount value (",
                       (char (*) [36])((ulong)uVar2 * 0x10 + *(long *)(local_38 + 0x18) + 8),
                       (uint *)") in destination description.",pacVar8);
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"VerifyCopyBLASAttribs",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                       ,0x3d2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != &msg.field_2) {
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            }
          }
          uVar2 = (int)local_60 + 1;
          local_60 = (char *)CONCAT44(local_60._4_4_,uVar2);
        } while (uVar2 < *(uint *)*local_48);
      }
      bVar7 = true;
    }
  }
  else {
    FormatString<char[40]>(&msg,(char (*) [40])"IDeviceContext::CopyBLAS: unknown Mode.");
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0,0);
    }
LAB_00478600:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool VerifyCopyBLASAttribs(const IRenderDevice* pDevice, const CopyBLASAttribs& Attribs)
{
#define CHECK_COPY_BLAS_ATTRIBS(Expr, ...) CHECK_PARAMETER(Expr, "Copy BLAS attribs are invalid: ", __VA_ARGS__)

    CHECK_COPY_BLAS_ATTRIBS(Attribs.pSrc != nullptr, "pSrc must not be null.");
    CHECK_COPY_BLAS_ATTRIBS(Attribs.pDst != nullptr, "pDst must not be null.");

    if (Attribs.Mode == COPY_AS_MODE_CLONE)
    {
        if (pDevice->GetDeviceInfo().Type == RENDER_DEVICE_TYPE_VULKAN)
        {
            const BottomLevelASDesc& SrcDesc = Attribs.pSrc->GetDesc();
            const BottomLevelASDesc& DstDesc = Attribs.pDst->GetDesc();

            CHECK_COPY_BLAS_ATTRIBS(SrcDesc.TriangleCount == DstDesc.TriangleCount,
                                    "Src BLAS triangle count (", SrcDesc.TriangleCount, ") must be equal to the dst BLAS triangle count (", DstDesc.TriangleCount, ").");

            CHECK_COPY_BLAS_ATTRIBS(SrcDesc.BoxCount == DstDesc.BoxCount,
                                    "Src BLAS box count (", SrcDesc.BoxCount, ") must be equal to the dst BLAS box count (", DstDesc.BoxCount, ").");

            CHECK_COPY_BLAS_ATTRIBS(SrcDesc.Flags == DstDesc.Flags,
                                    "Source and destination BLASes must have been created with the same flags.");

            for (Uint32 i = 0; i < SrcDesc.TriangleCount; ++i)
            {
                const BLASTriangleDesc& SrcTri = SrcDesc.pTriangles[i];
                const Uint32            Index  = Attribs.pDst->GetGeometryDescIndex(SrcTri.GeometryName);
                CHECK_COPY_BLAS_ATTRIBS(Index != INVALID_INDEX,
                                        "Src GeometryName ('", SrcTri.GeometryName, "') at index ", i, " is not found in pDst.");
                const BLASTriangleDesc& DstTri = DstDesc.pTriangles[Index];

                CHECK_COPY_BLAS_ATTRIBS(SrcTri.MaxVertexCount == DstTri.MaxVertexCount,
                                        "MaxVertexCount value (", SrcTri.MaxVertexCount, ") in source triangle description at index ", i,
                                        " does not match MaxVertexCount value (", DstTri.MaxVertexCount, ") in the destination description.");
                CHECK_COPY_BLAS_ATTRIBS(SrcTri.VertexValueType == DstTri.VertexValueType,
                                        "VertexValueType value (", GetValueTypeString(SrcTri.VertexValueType), ") in source triangle description at index ", i,
                                        " does not match VertexValueType value (", GetValueTypeString(DstTri.VertexValueType), ") in destination description.");
                CHECK_COPY_BLAS_ATTRIBS(SrcTri.VertexComponentCount == DstTri.VertexComponentCount,
                                        "VertexComponentCount value (", Uint32{SrcTri.VertexComponentCount}, ") in source triangle description at index ", i,
                                        " does not match VertexComponentCount value (", Uint32{DstTri.VertexComponentCount}, ") in destination description.");
                CHECK_COPY_BLAS_ATTRIBS(SrcTri.MaxPrimitiveCount == DstTri.MaxPrimitiveCount,
                                        "MaxPrimitiveCount value (", SrcTri.MaxPrimitiveCount, ") in source triangle description at index ", i,
                                        " does not match MaxPrimitiveCount value (", DstTri.MaxPrimitiveCount, ") in destination description.");
                CHECK_COPY_BLAS_ATTRIBS(SrcTri.IndexType == DstTri.IndexType,
                                        "IndexType value (", GetValueTypeString(SrcTri.IndexType), ") in source triangle description at index ", i,
                                        " does not match IndexType value (", GetValueTypeString(DstTri.IndexType), ") in destination description.");
                CHECK_COPY_BLAS_ATTRIBS(SrcTri.AllowsTransforms == DstTri.AllowsTransforms,
                                        "AllowsTransforms value (", (SrcTri.AllowsTransforms ? "true" : "false"), ") in source triangle description at index ", i,
                                        " does not match AllowsTransforms value (", (DstTri.AllowsTransforms ? "true" : "false"), ") in destination description.");
            }

            for (Uint32 i = 0; i < SrcDesc.BoxCount; ++i)
            {
                const BLASBoundingBoxDesc& SrcBox = SrcDesc.pBoxes[i];
                const Uint32               Index  = Attribs.pDst->GetGeometryDescIndex(SrcBox.GeometryName);
                if (Index == INVALID_INDEX)
                {
                    LOG_ERROR_MESSAGE("Copy BLAS attribs are invalid: pSrc->GetDesc().pBoxes[", i, "].GeometryName ('", SrcBox.GeometryName, "') is not found in pDst.");
                    return false;
                }
                const BLASBoundingBoxDesc& DstBox = DstDesc.pBoxes[Index];

                CHECK_COPY_BLAS_ATTRIBS(SrcBox.MaxBoxCount == DstBox.MaxBoxCount,
                                        "MaxBoxCount value (", SrcBox.MaxBoxCount, ") in source box description at index ", i,
                                        " does not match MaxBoxCount value (", DstBox.MaxBoxCount, ") in destination description.");
            }
        }
    }
    else if (Attribs.Mode == COPY_AS_MODE_COMPACT)
    {
        const BottomLevelASDesc& SrcDesc = Attribs.pSrc->GetDesc();
        const BottomLevelASDesc& DstDesc = Attribs.pDst->GetDesc();

        CHECK_COPY_BLAS_ATTRIBS((SrcDesc.Flags & RAYTRACING_BUILD_AS_ALLOW_COMPACTION) == RAYTRACING_BUILD_AS_ALLOW_COMPACTION, "must be have been create with RAYTRACING_BUILD_AS_ALLOW_COMPACTION flag.");
        CHECK_COPY_BLAS_ATTRIBS(DstDesc.CompactedSize != 0, "pDst must have been create with non-zero CompactedSize.");
    }
    else
    {
        LOG_ERROR_MESSAGE("IDeviceContext::CopyBLAS: unknown Mode.");
        return false;
    }

#undef CHECK_COPY_BLAS_ATTRIBS

    return true;
}